

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O1

bool __thiscall
brynet::net::WrapTcpService::_addSession
          (WrapTcpService *this,PTR *socket,
          vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
          *optionFuncs)

{
  TCPSession *this_00;
  _Any_data *p_Var1;
  TcpService *this_01;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _func_void *p_Var3;
  function<void_(brynet::net::AddSessionOption::Options_&)> *v;
  _Any_data *p_Var4;
  pointer *__ptr;
  _Head_base<0UL,_brynet::net::TcpSocket_*,_false> local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  _Any_data local_208;
  code *local_1f8;
  PTR local_1e8;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  AddSocketOptionFunc sslOption;
  anon_class_64_3_faec5c49 enterCallback;
  Options options;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d0;
  code *local_c0;
  _Any_data local_b0;
  code *local_a0;
  SESSION_ENTER_CALLBACK userEnterCallback;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  options.maxRecvBufferSize = 0;
  options.enterCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  options.enterCallback.super__Function_base._M_functor._8_8_ = 0;
  options.enterCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  options.enterCallback._M_invoker = (_Invoker_type)0x0;
  options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  options.useSSL = false;
  options.forceSameThreadLoop = false;
  p_Var4 = (_Any_data *)
           (optionFuncs->
           super__Vector_base<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Any_data *)
           (optionFuncs->
           super__Vector_base<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var4 != p_Var1) {
    do {
      if (*(long *)(p_Var4 + 1) != 0) {
        (**(code **)((long)p_Var4 + 0x18))(p_Var4,&options);
      }
      p_Var4 = p_Var4 + 2;
    } while (p_Var4 != p_Var1);
  }
  this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xb0);
  this_02->_M_use_count = 1;
  this_02->_M_weak_count = 1;
  this_02->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147e58;
  this_00 = (TCPSession *)(this_02 + 1);
  memset(this_00,0,0xa0);
  TCPSession::TCPSession(this_00);
  this_02[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TCPSession_00147ea8;
  *(element_type **)&this_02[1]._M_use_count =
       (this->mTCPService).super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this_02 + 2),
             &(this->mTCPService).
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            (&userEnterCallback,&options.enterCallback);
  enterCallback.sharedTCPService.
  super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->mTCPService).super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_210 = (this->mTCPService).
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_210->_M_use_count = local_210->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_210->_M_use_count = local_210->_M_use_count + 1;
    }
  }
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_210->_M_use_count = local_210->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_210->_M_use_count = local_210->_M_use_count + 1;
    }
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_02->_M_use_count = this_02->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_02->_M_use_count = this_02->_M_use_count + 1;
  }
  enterCallback.sharedTCPService.
  super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_210;
  enterCallback.tmpSession.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  enterCallback.tmpSession.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this_02;
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            (&enterCallback.userEnterCallback,&userEnterCallback);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_02->_M_use_count = this_02->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_02->_M_use_count = this_02->_M_use_count + 1;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_02->_M_use_count = this_02->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_02->_M_use_count = this_02->_M_use_count + 1;
  }
  sslOption.super__Function_base._M_manager = (_Manager_type)0x0;
  sslOption._M_invoker = (_Invoker_type)0x0;
  sslOption.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  sslOption.super__Function_base._M_functor._8_8_ = 0;
  if (options.useSSL == true) {
    bVar2 = TcpSocket::isServerSide
                      ((socket->_M_t).
                       super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                       .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
    if (bVar2) {
      local_1e8.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_1e8.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = options.sslHelper.
              super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      if (options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (options.sslHelper.
                super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (options.sslHelper.
                super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      TcpService::AddSocketOption::WithServerSideSSL((AddSocketOptionFunc *)&local_208,&local_1e8);
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::operator=
                (&sslOption,
                 (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)&local_208)
      ;
      if (local_1f8 != (code *)0x0) {
        (*local_1f8)(&local_208,&local_208,__destroy_functor);
      }
      if (local_1e8.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e8.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      TcpService::AddSocketOption::WithClientSideSSL();
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::operator=
                (&sslOption,
                 (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)&local_208)
      ;
      if (local_1f8 != (code *)0x0) {
        (*local_1f8)(&local_208,&local_208,__destroy_functor);
      }
    }
  }
  this_01 = (this->mTCPService).
            super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_218._M_head_impl =
       (socket->_M_t).
       super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
       super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
       super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl;
  (socket->_M_t).
  super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
  super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
  super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl = (TcpSocket *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  p_Var3 = (_func_void *)operator_new(0x40);
  *(element_type **)p_Var3 =
       enterCallback.sharedTCPService.
       super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var3 + 8) =
       enterCallback.sharedTCPService.
       super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (enterCallback.sharedTCPService.
      super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (enterCallback.sharedTCPService.
       super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (enterCallback.sharedTCPService.
                      super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (enterCallback.sharedTCPService.
       super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (enterCallback.sharedTCPService.
                      super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  *(element_type **)(p_Var3 + 0x10) =
       enterCallback.tmpSession.
       super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var3 + 0x18) =
       enterCallback.tmpSession.
       super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (enterCallback.tmpSession.
      super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (enterCallback.tmpSession.
       super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (enterCallback.tmpSession.
                      super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (enterCallback.tmpSession.
       super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (enterCallback.tmpSession.
                      super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            ((function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> *)(p_Var3 + 0x20),
             &enterCallback.userEnterCallback);
  pcStack_1c0 = std::
                _Function_handler<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:211:26)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:211:26)>
              ::_M_manager;
  local_1d8._M_unused._0_8_ = (undefined8)p_Var3;
  TcpService::AddSocketOption::WithEnterCallback
            ((AddSocketOptionFunc *)&local_208,(ENTER_CALLBACK *)&local_1d8);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = operator_new(0x10);
  *(TCPSession **)local_f8._M_unused._0_8_ = this_00;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 8) = this_02;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_02->_M_use_count = this_02->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_02->_M_use_count = this_02->_M_use_count + 1;
  }
  pcStack_e0 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:224:26)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:224:26)>
             ::_M_manager;
  TcpService::AddSocketOption::WithDisconnectCallback
            ((AddSocketOptionFunc *)&local_b0,(DISCONNECT_CALLBACK *)&local_f8);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x10);
  *(TCPSession **)local_118._M_unused._0_8_ = this_00;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_118._M_unused._0_8_ + 8) = this_02;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_02->_M_use_count = this_02->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_02->_M_use_count = this_02->_M_use_count + 1;
  }
  pcStack_100 = std::
                _Function_handler<unsigned_long_(long,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:232:24)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<unsigned_long_(long,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:232:24)>
              ::_M_manager;
  TcpService::AddSocketOption::WithDataCallback
            ((AddSocketOptionFunc *)&local_d0,(DATA_CALLBACK *)&local_118);
  TcpService::AddSocketOption::WithMaxRecvBufferSize(options.maxRecvBufferSize);
  TcpService::AddSocketOption::WithForceSameThreadLoop(options.forceSameThreadLoop);
  bVar2 = TcpService::
          addDataSocket<std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>>
                    (this_01,(PTR *)&local_218,&sslOption,
                     (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)
                     &local_208,
                     (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)
                     &local_b0,
                     (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)
                     &local_d0,
                     (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)
                     &local_50,
                     (function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> *)
                     &local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,__destroy_functor);
  }
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  if (local_218._M_head_impl != (TcpSocket *)0x0) {
    (*(local_218._M_head_impl)->_vptr_TcpSocket[1])();
  }
  local_218._M_head_impl = (TcpSocket *)0x0;
  if (sslOption.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*sslOption.super__Function_base._M_manager)
              ((_Any_data *)&sslOption,(_Any_data *)&sslOption,__destroy_functor);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  if (enterCallback.userEnterCallback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*enterCallback.userEnterCallback.super__Function_base._M_manager)
              ((_Any_data *)&enterCallback.userEnterCallback,
               (_Any_data *)&enterCallback.userEnterCallback,__destroy_functor);
  }
  if (enterCallback.tmpSession.
      super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (enterCallback.tmpSession.
               super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (enterCallback.sharedTCPService.
      super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (enterCallback.sharedTCPService.
               super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
  }
  if (userEnterCallback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*userEnterCallback.super__Function_base._M_manager)
              ((_Any_data *)&userEnterCallback,(_Any_data *)&userEnterCallback,__destroy_functor);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  if (options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (options.sslHelper.
               super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (options.enterCallback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*options.enterCallback.super__Function_base._M_manager)
              ((_Any_data *)&options,(_Any_data *)&options,__destroy_functor);
  }
  return bVar2;
}

Assistant:

bool WrapTcpService::_addSession(TcpSocket::PTR socket,
    const std::vector<AddSessionOption::AddSessionOptionFunc>& optionFuncs)
{
    struct AddSessionOption::Options options;
    for (const auto& v : optionFuncs)
    {
        if (v != nullptr)
        {
            v(options);
        }
    }

    auto tmpSession = TCPSession::Create();
    tmpSession->setService(mTCPService);

    auto userEnterCallback = options.enterCallback;
    auto sharedTCPService = mTCPService;
    auto enterCallback = [sharedTCPService,
        tmpSession,
        userEnterCallback](TcpService::SESSION_TYPE id,
            const std::string& ip) mutable {
        tmpSession->setIOLoopData(sharedTCPService->getIOLoopDataBySocketID(id));
        tmpSession->setSocketID(id);
        tmpSession->setIP(ip);
        if (userEnterCallback != nullptr)
        {
            userEnterCallback(tmpSession);
        }
    };

    auto closeCallback = [tmpSession](TcpService::SESSION_TYPE id) mutable {
        const auto& callback = tmpSession->getCloseCallback();
        if (callback != nullptr)
        {
            callback(tmpSession);
        }
    };

    auto msgCallback = [tmpSession](TcpService::SESSION_TYPE id,
        const char* buffer,
        size_t len) mutable {
        const auto& callback = tmpSession->getDataCallback();
        if (callback != nullptr)
        {
            return callback(tmpSession, buffer, len);
        }
        else
        {
            return static_cast<size_t>(0);
        }
    };

    TcpService::AddSocketOption::AddSocketOptionFunc sslOption;
    if (options.useSSL)
    {
        if (socket->isServerSide())
        {
            sslOption = TcpService::AddSocketOption::WithServerSideSSL(options.sslHelper);
        }
        else
        {
            sslOption = TcpService::AddSocketOption::WithClientSideSSL();
        }
    }

    return mTCPService->addDataSocket(std::move(socket),
        sslOption,
        TcpService::AddSocketOption::WithEnterCallback(enterCallback),
        TcpService::AddSocketOption::WithDisconnectCallback(closeCallback),
        TcpService::AddSocketOption::WithDataCallback(msgCallback),
        TcpService::AddSocketOption::WithMaxRecvBufferSize(options.maxRecvBufferSize),
        TcpService::AddSocketOption::WithForceSameThreadLoop(options.forceSameThreadLoop));
}